

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BinSelectWithFilterExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinSelectWithFilterExprSyntax,slang::syntax::BinsSelectExpressionSyntax&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::MatchesClauseSyntax*&>
          (BumpAllocator *this,BinsSelectExpressionSyntax *args,Token *args_1,Token *args_2,
          ExpressionSyntax *args_3,Token *args_4,MatchesClauseSyntax **args_5)

{
  Token with;
  Token openParen;
  Token closeParen;
  BinSelectWithFilterExprSyntax *this_00;
  Token *args_local_4;
  ExpressionSyntax *args_local_3;
  Token *args_local_2;
  Token *args_local_1;
  BinsSelectExpressionSyntax *args_local;
  BumpAllocator *this_local;
  
  this_00 = (BinSelectWithFilterExprSyntax *)allocate(this,0x58,8);
  with.kind = args_1->kind;
  with._2_1_ = args_1->field_0x2;
  with.numFlags.raw = (args_1->numFlags).raw;
  with.rawLen = args_1->rawLen;
  with.info = args_1->info;
  openParen.kind = args_2->kind;
  openParen._2_1_ = args_2->field_0x2;
  openParen.numFlags.raw = (args_2->numFlags).raw;
  openParen.rawLen = args_2->rawLen;
  openParen.info = args_2->info;
  closeParen.kind = args_4->kind;
  closeParen._2_1_ = args_4->field_0x2;
  closeParen.numFlags.raw = (args_4->numFlags).raw;
  closeParen.rawLen = args_4->rawLen;
  closeParen.info = args_4->info;
  slang::syntax::BinSelectWithFilterExprSyntax::BinSelectWithFilterExprSyntax
            (this_00,args,with,openParen,args_3,closeParen,*args_5);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }